

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::TryMatchCharInst::Exec
          (TryMatchCharInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  CharCount CVar2;
  Label LVar3;
  uint uVar4;
  PageAllocation *pPVar5;
  size_t sVar6;
  code *pcVar7;
  bool bVar8;
  undefined4 *puVar9;
  uchar *puVar10;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if ((*inputOffset < inputLength) && (input[*inputOffset] == (this->super_CharMixin).c)) {
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize -
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop < 0x20) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar8) {
LAB_00f0edb0:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar9 = 0;
    }
    pPVar5 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar6 + 0x20;
    *(size_t *)((long)&pPVar5[1].pageCount + sVar6) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x20;
    CVar2 = *inputOffset;
    LVar3 = (this->super_TryMixin).failLabel;
    *(undefined1 *)((long)&pPVar5[2].pageCount + sVar6) = 0;
    *(undefined ***)((long)&pPVar5[1].segment + sVar6) = &PTR_Print_01559788;
    *(CharCount *)((long)&pPVar5[2].pageCount + sVar6 + 4) = CVar2;
    *(Label *)((long)&pPVar5[2].segment + sVar6) = LVar3;
    Matcher::PushStats(matcher,contStack,input);
    *inputOffset = *inputOffset + 1;
    puVar10 = *instPointer + 7;
  }
  else {
    uVar4 = (this->super_TryMixin).failLabel;
    if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x76d,"(label < program->rep.insts.instsLen)",
                         "label < program->rep.insts.instsLen");
      if (!bVar8) goto LAB_00f0edb0;
      *puVar9 = 0;
    }
    puVar10 = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar4;
  }
  *instPointer = puVar10;
  return false;
}

Assistant:

inline bool TryMatchCharInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && input[inputOffset] == c)
        {
            // CHOICEPOINT: Resume at fail label on backtrack
            PUSH(contStack, ResumeCont, inputOffset, failLabel);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            inputOffset++;
            instPointer += sizeof(*this);
            return false;
        }

        // Proceed directly to exit
        instPointer = matcher.LabelToInstPointer(failLabel);
        return false;
    }